

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jasmin.cpp
# Opt level: O0

void __thiscall Oric::Jasmin::set_activity_observer(Jasmin *this,Observer *observer)

{
  Observer *pOVar1;
  allocator<char> local_71;
  string local_70 [55];
  allocator<char> local_39;
  string local_38 [32];
  Observer *local_18;
  Observer *observer_local;
  Jasmin *this_local;
  
  this->observer_ = observer;
  if (observer != (Observer *)0x0) {
    local_18 = observer;
    observer_local = (Observer *)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_38,"Jasmin",&local_39);
    (*observer->_vptr_Observer[2])(observer,local_38,0);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator(&local_39);
    pOVar1 = this->observer_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_70,"Jasmin",&local_71);
    (*pOVar1->_vptr_Observer[4])
              (pOVar1,local_70,(ulong)((byte)(this->super_DiskController).field_0x4e4 & 1));
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  return;
}

Assistant:

void Jasmin::set_activity_observer(Activity::Observer *observer) {
	observer_ = observer;
	if(observer) {
		observer->register_led("Jasmin");
		observer_->set_led_status("Jasmin", motor_on_);
	}
}